

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_eol
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  byte *s_00;
  char_t *pcVar2;
  bool bVar3;
  gap g;
  gap local_38;
  
  local_38.end = (byte *)0x0;
  local_38.size = 0;
  do {
    s_00 = s;
    if (((anonymous_namespace)::chartype_table[*s] & 2) == 0) {
      if (((anonymous_namespace)::chartype_table[s[1]] & 2) != 0) {
        s_00 = s + 1;
        goto LAB_0010cefe;
      }
      if (((anonymous_namespace)::chartype_table[s[2]] & 2) != 0) {
        s_00 = s + 2;
        goto LAB_0010cefe;
      }
      bVar3 = ((anonymous_namespace)::chartype_table[s[3]] & 2) == 0;
      if (bVar3) {
        s_00 = s + 4;
      }
      else {
        s_00 = s + 3;
      }
    }
    else {
LAB_0010cefe:
      bVar3 = false;
    }
    s = s_00;
    if (!bVar3) {
      bVar1 = *s_00;
      if (bVar1 == end_quote) {
        pcVar2 = gap::flush(&local_38,s_00);
        *pcVar2 = '\0';
        return s_00 + 1;
      }
      if (bVar1 == 0xd) {
        s = s_00 + 1;
        *s_00 = 10;
        if (s_00[1] == 10) {
          if (local_38.end != (byte *)0x0) {
            if (s < local_38.end) {
              __assert_fail("s >= end",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                            ,0x974,
                            "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
            }
            memmove(local_38.end + -local_38.size,local_38.end,(long)s - (long)local_38.end);
          }
          s = s_00 + 2;
          local_38.size = local_38.size + 1;
          local_38.end = s;
        }
      }
      else if (bVar1 == 0x26) {
        s = strconv_escape(s_00,&local_38);
      }
      else {
        if (bVar1 == 0) {
          return (char_t *)0x0;
        }
        s = s_00 + 1;
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}